

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushID(char *str_id_begin,char *str_id_end)

{
  int *piVar1;
  ImGuiWindow *this;
  ImGuiID *pIVar2;
  ImGuiID IVar3;
  wchar_t wVar4;
  ImGuiID *__dest;
  wchar_t wVar5;
  wchar_t wVar6;
  
  this = (ImGuiWindow *)GImGui->CurrentWindow;
  IVar3 = ImGuiWindow::GetIDNoKeepAlive(this,str_id_begin,str_id_end);
  wVar4 = (this->IDStack).Size;
  if (wVar4 == (this->IDStack).Capacity) {
    if (wVar4 == L'\0') {
      wVar5 = L'\b';
    }
    else {
      wVar5 = wVar4 / 2 + wVar4;
    }
    wVar6 = wVar4 + L'\x01';
    if (wVar4 + L'\x01' < wVar5) {
      wVar6 = wVar5;
    }
    if (GImGui != (ImGuiContext_conflict1 *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (ImGuiID *)(*GImAllocatorAllocFunc)((long)wVar6 << 2,GImAllocatorUserData);
    pIVar2 = (this->IDStack).Data;
    if (pIVar2 != (ImGuiID *)0x0) {
      memcpy(__dest,pIVar2,(long)(this->IDStack).Size << 2);
      pIVar2 = (this->IDStack).Data;
      if ((pIVar2 != (ImGuiID *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
    }
    (this->IDStack).Data = __dest;
    (this->IDStack).Capacity = wVar6;
    wVar4 = (this->IDStack).Size;
  }
  else {
    __dest = (this->IDStack).Data;
  }
  __dest[wVar4] = IVar3;
  (this->IDStack).Size = (this->IDStack).Size + L'\x01';
  return;
}

Assistant:

void ImGui::PushID(const char* str_id_begin, const char* str_id_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiID id = window->GetIDNoKeepAlive(str_id_begin, str_id_end);
    window->IDStack.push_back(id);
}